

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_type __thiscall llvm::StringRef::find_first_not_of(StringRef *this,char C,size_t From)

{
  unsigned_long *puVar1;
  size_type e;
  size_type i;
  size_t From_local;
  StringRef *pSStack_18;
  char C_local;
  StringRef *this_local;
  
  i = From;
  From_local._7_1_ = C;
  pSStack_18 = this;
  puVar1 = std::min<unsigned_long>(&i,&this->Length);
  e = *puVar1;
  while( true ) {
    if (e == this->Length) {
      return 0xffffffffffffffff;
    }
    if (this->Data[e] != From_local._7_1_) break;
    e = e + 1;
  }
  return e;
}

Assistant:

StringRef::size_type StringRef::find_first_not_of(char C, size_t From) const {
  for (size_type i = std::min(From, Length), e = Length; i != e; ++i)
    if (Data[i] != C)
      return i;
  return npos;
}